

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alist.c
# Opt level: O3

size_t expand_array_list(p_array_list alist)

{
  size_t sVar1;
  void **__src;
  void **__dest;
  
  sVar1 = alist->size;
  __dest = (void **)calloc(1,sVar1 << 4);
  __src = alist->array;
  memcpy(__dest,__src,sVar1 << 3);
  free(__src);
  alist->array = __dest;
  alist->size = sVar1 * 2;
  return sVar1 * 2;
}

Assistant:

size_t expand_array_list(p_array_list alist) {
    size_t size = alist->size;
    size_t new_size = size * 2;
    void** array = (void**)malloc(sizeof(void*) * new_size);
    memset(array, 0, sizeof(void*) * new_size);
    memcpy(array, alist->array, sizeof(void*) * size);
    free(alist->array);
    alist->array = array;
    alist->size = new_size;
    return new_size;
}